

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutokeyCipher.cpp
# Opt level: O3

int __thiscall
AutokeyCipher::decrypt
          (AutokeyCipher *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  undefined8 uVar1;
  ulong uVar2;
  short sVar3;
  uint uVar4;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,*(long *)out,*(long *)(out + 8) + *(long *)out);
  uVar1 = *(undefined8 *)(out + 8);
  if (0 < (int)(uint)uVar1) {
    uVar2 = 0;
    do {
      sVar3 = ((short)*(char *)(*(long *)out + uVar2) - (short)*(char *)(*(long *)ctx + uVar2)) +
              0x1a;
      uVar4 = sVar3 * 0x4ec5;
      (this->key)._M_dataplus._M_p[uVar2] =
           (char)sVar3 + ((char)(uVar4 >> 0x13) - (char)((int)uVar4 >> 0x1f)) * -0x1a + 'a';
      uVar2 = uVar2 + 1;
    } while (((uint)uVar1 & 0x7fffffff) != uVar2);
  }
  return (int)this;
}

Assistant:

string AutokeyCipher::decrypt(const string& str) { // Decrypt a string
    string decrypted = str;

    // Subtract key from msg (cyclic)
    int str_len = str.length();
    for(int i=0; i<str_len; ++i){
        decrypted[i] = FIRST_LETTER + (str[i] - key[i] + TOTAL_LETTERS)%TOTAL_LETTERS;
    }

    return decrypted;
}